

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O0

int iemgui_dialog(t_iemgui *iemgui,t_symbol **srl,int argc,t_atom *argv)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  t_symbol *ptVar7;
  t_float tVar8;
  t_float tVar9;
  t_float tVar10;
  int local_e4;
  uint local_e0;
  int i;
  int oldsndrcvable;
  int rcv_changed;
  int lcol;
  int fcol;
  int bcol;
  int fs;
  int f;
  int ldy;
  int ldx;
  int init;
  char str [144];
  t_atom *argv_local;
  int argc_local;
  t_symbol **srl_local;
  t_iemgui *iemgui_local;
  
  str._136_8_ = argv;
  tVar8 = atom_getfloatarg(5,argc,argv);
  ldy = (int)tVar8;
  tVar8 = atom_getfloatarg(10,argc,(t_atom *)str._136_8_);
  tVar9 = atom_getfloatarg(0xb,argc,(t_atom *)str._136_8_);
  tVar10 = atom_getfloatarg(0xc,argc,(t_atom *)str._136_8_);
  bcol = (int)tVar10;
  tVar10 = atom_getfloatarg(0xd,argc,(t_atom *)str._136_8_);
  fcol = (int)tVar10;
  uVar2 = iemgui_getcolorarg(0xe,argc,(t_atom *)str._136_8_);
  uVar3 = iemgui_getcolorarg(0xf,argc,(t_atom *)str._136_8_);
  uVar4 = iemgui_getcolorarg(0x10,argc,(t_atom *)str._136_8_);
  bVar1 = false;
  local_e0 = 0;
  if (((uint)iemgui->x_fsf >> 6 & 1) != 0) {
    local_e0 = 2;
  }
  if (((uint)iemgui->x_fsf >> 7 & 1) != 0) {
    local_e0 = local_e0 | 1;
  }
  if (*(int *)(str._136_8_ + 0x70) == 2) {
    ptVar7 = atom_getsymbolarg(7,argc,(t_atom *)str._136_8_);
    *srl = ptVar7;
  }
  else if (*(int *)(str._136_8_ + 0x70) == 1) {
    ptVar7 = gensym("empty");
    *srl = ptVar7;
  }
  if (*(int *)(str._136_8_ + 0x80) == 2) {
    ptVar7 = atom_getsymbolarg(8,argc,(t_atom *)str._136_8_);
    srl[1] = ptVar7;
  }
  else if (*(int *)(str._136_8_ + 0x80) == 1) {
    ptVar7 = gensym("empty");
    srl[1] = ptVar7;
  }
  if (*(int *)(str._136_8_ + 0x90) == 2) {
    ptVar7 = atom_getsymbolarg(9,argc,(t_atom *)str._136_8_);
    srl[2] = ptVar7;
  }
  else if (*(int *)(str._136_8_ + 0x90) == 1) {
    tVar10 = atom_getfloatarg(9,argc,(t_atom *)str._136_8_);
    sprintf((char *)&ldx,"%g",(double)tVar10);
    ptVar7 = gensym((char *)&ldx);
    srl[2] = ptVar7;
  }
  if (ldy != 0) {
    ldy = 1;
  }
  iemgui->x_isa = (t_iem_init_symargs)((uint)iemgui->x_isa & 0xfffffffe | ldy & 1U);
  for (local_e4 = 0; local_e4 < 3; local_e4 = local_e4 + 1) {
    iVar5 = srl_is_valid(srl[local_e4]);
    if ((iVar5 == 0) || (iVar5 = strcmp(srl[local_e4]->s_name,"empty"), iVar5 == 0)) {
      srl[local_e4] = &s_;
    }
  }
  iemgui_all_dollararg2sym(iemgui,srl);
  iVar5 = srl_is_valid(iemgui->x_rcv);
  if ((((iVar5 == 0) && (iVar5 = srl_is_valid(srl[1]), iVar5 != 0)) ||
      ((iVar5 = srl_is_valid(iemgui->x_rcv), iVar5 != 0 &&
       (iVar5 = srl_is_valid(srl[1]), iVar5 == 0)))) ||
     (((iVar5 = srl_is_valid(iemgui->x_rcv), iVar5 != 0 &&
       (iVar5 = srl_is_valid(srl[1]), iVar5 != 0)) && (iemgui->x_rcv != srl[1])))) {
    bVar1 = true;
  }
  if ((bVar1) && (iVar5 = srl_is_valid(iemgui->x_rcv), iVar5 != 0)) {
    pd_unbind((t_pd *)iemgui,iemgui->x_rcv);
  }
  iemgui->x_snd = *srl;
  uVar6 = srl_is_valid(*srl);
  iemgui->x_fsf = (t_iem_fstyle_flags)((uint)iemgui->x_fsf & 0xffffff7f | (uVar6 & 1) << 7);
  iemgui->x_rcv = srl[1];
  uVar6 = srl_is_valid(srl[1]);
  iemgui->x_fsf = (t_iem_fstyle_flags)((uint)iemgui->x_fsf & 0xffffffbf | (uVar6 & 1) << 6);
  iemgui->x_lab = srl[2];
  iemgui->x_lcol = uVar4 & 0xffffff;
  iemgui->x_fcol = uVar3 & 0xffffff;
  iemgui->x_bcol = uVar2 & 0xffffff;
  iemgui->x_ldx = (int)tVar8;
  iemgui->x_ldy = (int)tVar9;
  if (bcol == 1) {
    strcpy(iemgui->x_font,"helvetica");
  }
  else if (bcol == 2) {
    strcpy(iemgui->x_font,"times");
  }
  else {
    bcol = 0;
    strcpy(iemgui->x_font,sys_font);
  }
  iemgui->x_fsf = (t_iem_fstyle_flags)((uint)iemgui->x_fsf & 0xffffffc0 | bcol & 0x3fU);
  if (fcol < 4) {
    fcol = 4;
  }
  iemgui->x_fontsize = fcol;
  if ((bVar1) && (iVar5 = srl_is_valid(iemgui->x_rcv), iVar5 != 0)) {
    pd_bind((t_pd *)iemgui,iemgui->x_rcv);
  }
  iemgui_verify_snd_ne_rcv(iemgui);
  canvas_dirty(iemgui->x_glist,1.0);
  return local_e0;
}

Assistant:

int iemgui_dialog(t_iemgui *iemgui, t_symbol **srl, int argc, t_atom *argv)
{
    char str[144];
    int init = (int)atom_getfloatarg(5, argc, argv);
    int ldx = (int)atom_getfloatarg(10, argc, argv);
    int ldy = (int)atom_getfloatarg(11, argc, argv);
    int f = (int)atom_getfloatarg(12, argc, argv);
    int fs = (int)atom_getfloatarg(13, argc, argv);
    int bcol = (int)iemgui_getcolorarg(14, argc, argv);
    int fcol = (int)iemgui_getcolorarg(15, argc, argv);
    int lcol = (int)iemgui_getcolorarg(16, argc, argv);
    int rcv_changed=0, oldsndrcvable=0;
    int i;

    if(iemgui->x_fsf.x_rcv_able)
        oldsndrcvable |= IEM_GUI_OLD_RCV_FLAG;
    if(iemgui->x_fsf.x_snd_able)
        oldsndrcvable |= IEM_GUI_OLD_SND_FLAG;
    if(IS_A_SYMBOL(argv,7))
        srl[0] = atom_getsymbolarg(7, argc, argv);
    else if(IS_A_FLOAT(argv,7))
    {
        srl[0] = gensym("empty");
    }
    if(IS_A_SYMBOL(argv,8))
        srl[1] = atom_getsymbolarg(8, argc, argv);
    else if(IS_A_FLOAT(argv,8))
    {
        srl[1] = gensym("empty");
    }
    if(IS_A_SYMBOL(argv,9))
        srl[2] = atom_getsymbolarg(9, argc, argv);
    else if(IS_A_FLOAT(argv,9))
    {
        sprintf(str, "%g", atom_getfloatarg(9, argc, argv));
        srl[2] = gensym(str);
    }
    if(init != 0) init = 1;
    iemgui->x_isa.x_loadinit = init;
    for(i=0; i<3; i++)
        if(!srl_is_valid(srl[i]) || (!strcmp(srl[i]->s_name, "empty"))) srl[i] = &s_;

        /* expand dollargs
         * after this, srl holds the $-expanded versions of the labels
         * and iemgui->x_(snd|rcv|lab)_unexpanded hold the unexpanded versions
         */
    iemgui_all_dollararg2sym(iemgui, srl);

        /* check if the receiver changed */
    if(0
       || (!srl_is_valid(iemgui->x_rcv) && srl_is_valid(srl[1])) /* there was none, but now there is */
       || ( srl_is_valid(iemgui->x_rcv) && !(srl_is_valid(srl[1]))) /* there was one, but now there is */
       || ( srl_is_valid(iemgui->x_rcv) && srl_is_valid(srl[1]) && iemgui->x_rcv != srl[1])) /* both are valid, but changed */
        rcv_changed = 1;

        /* if the receiver changed (and was previously set), unbind it */
    if(rcv_changed && srl_is_valid(iemgui->x_rcv))
        pd_unbind(&iemgui->x_obj.ob_pd, iemgui->x_rcv);

    iemgui->x_snd = srl[0];
    iemgui->x_fsf.x_snd_able = srl_is_valid(srl[0]);
    iemgui->x_rcv = srl[1];
    iemgui->x_fsf.x_rcv_able = srl_is_valid(srl[1]);
    iemgui->x_lab = srl[2];
    iemgui->x_lcol = lcol & 0xffffff;
    iemgui->x_fcol = fcol & 0xffffff;
    iemgui->x_bcol = bcol & 0xffffff;
    iemgui->x_ldx = ldx;
    iemgui->x_ldy = ldy;
    if(f == 1) strcpy(iemgui->x_font, "helvetica");
    else if(f == 2) strcpy(iemgui->x_font, "times");
    else
    {
        f = 0;
        strcpy(iemgui->x_font, sys_font);
    }
    iemgui->x_fsf.x_font_style = f;
    if(fs < 4)
        fs = 4;
    iemgui->x_fontsize = fs;

        /* if the receiver changed (and is now set), bind it */
    if(rcv_changed && srl_is_valid(iemgui->x_rcv))
        pd_bind(&iemgui->x_obj.ob_pd, iemgui->x_rcv);

    iemgui_verify_snd_ne_rcv(iemgui);
    canvas_dirty(iemgui->x_glist, 1);
    return(oldsndrcvable);
}